

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_main.c
# Opt level: O1

int sys_main(int argc,char **argv)

{
  __uid_t _Var1;
  __uid_t _Var2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  t_namelist *ptVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  int nmidioutdev;
  int nmidiindev;
  int midioutdev [16];
  int midiindev [16];
  char sbuf [1000];
  int local_4bc;
  int local_4b8;
  int local_4b4;
  ulong local_4b0;
  char *local_4a8;
  ulong local_4a0;
  int local_498 [16];
  int local_458 [16];
  char local_418 [8];
  char acStack_410 [8];
  undefined1 auStack_408 [954];
  undefined1 local_4e;
  
  uVar10 = (ulong)(uint)argc;
  sys_externalschedlib = 0;
  sys_extraflags = 0;
  _Var1 = getuid();
  _Var2 = geteuid();
  if (_Var1 != _Var2) {
    sys_main_cold_1();
  }
  iVar3 = socket_init();
  if (iVar3 != 0) {
    sys_sockerror("socket_init()");
  }
  pd_init();
  sys_findprogdir(*argv);
  if (argc < 1) {
    pcVar9 = "";
    bVar12 = true;
  }
  else {
    uVar11 = 0;
    local_4a8 = "";
    local_4b4 = 0;
    local_4b0 = uVar10;
    local_4a0 = uVar10;
    do {
      pcVar9 = argv[uVar11];
      iVar3 = strcmp(pcVar9,"-noprefs");
      if (iVar3 == 0) {
        local_4b4 = 1;
      }
      else {
        iVar3 = strcmp(pcVar9,"-prefsfile");
        if ((long)uVar11 < (long)(argc + -1) && iVar3 == 0) {
          local_4a8 = argv[uVar11 + 1];
        }
        else {
          iVar3 = strcmp(pcVar9,"-schedlib");
          if (iVar3 == 0 && (long)uVar11 < (long)(argc + -1)) {
            sys_externalschedlib = 1;
            uVar10 = local_4b0;
          }
          else {
            iVar3 = strcmp(pcVar9,"-h");
            uVar10 = local_4b0;
            if ((iVar3 == 0) || (iVar3 = strcmp(pcVar9,"-help"), iVar3 == 0)) {
              sys_printusage();
              return 1;
            }
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
    bVar12 = local_4b4 == 0;
    argc = (int)local_4a0;
    pcVar9 = local_4a8;
  }
  if (bVar12) {
    sys_loadpreferences(pcVar9,1);
  }
  iVar3 = sys_argparse(argc + -1,argv + 1);
  iVar4 = 1;
  if (iVar3 == 0) {
    if ((sys_verbose != 0) || ((sys_version & 1) != 0)) {
      sys_main_cold_2();
    }
    if (sys_verbose != 0) {
      sys_main_cold_3();
    }
    if (sys_version == 1) {
      fflush(_stderr);
      iVar4 = 0;
    }
    else {
      sys_setsignalhandlers();
      local_4b8 = 0;
      local_4bc = 0;
      strncpy(local_418,sys_libdir->s_name,0x3ca);
      local_4e = 0;
      sVar5 = strlen(local_418);
      builtin_strncpy(local_418 + sVar5,"/extra",7);
      sys_setextrapath(local_418);
      strncpy(local_418,sys_libdir->s_name,0x3ca);
      local_4e = 0;
      sVar5 = strlen(local_418);
      auStack_408[sVar5] = 0;
      builtin_strncpy(local_418 + sVar5,"/doc/5.r",8);
      builtin_strncpy(acStack_410 + sVar5,"eference",8);
      ptVar6 = namelist_append_files((pd_maininstance.pd_stuff)->st_helppath,local_418);
      (pd_maininstance.pd_stuff)->st_helppath = ptVar6;
      lVar7 = (long)sys_nmidiin;
      if (0 < lVar7) {
        lVar8 = 0;
        do {
          sys_midiindevlist[lVar8] = sys_midiindevlist[lVar8] + -1;
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      lVar7 = (long)sys_nmidiout;
      if (0 < lVar7) {
        lVar8 = 0;
        do {
          sys_midioutdevlist[lVar8] = sys_midioutdevlist[lVar8] + -1;
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      if (sys_listplease == '\x01') {
        sys_listdevs();
      }
      sys_get_midi_params(&local_4b8,local_458,&local_4bc,local_498);
      if ((-1 < (long)sys_nmidiin) && (local_4b8 = sys_nmidiin, sys_nmidiin != 0)) {
        memcpy(local_458,sys_midiindevlist,(long)sys_nmidiin << 2);
      }
      if ((-1 < (long)sys_nmidiout) && (local_4bc = sys_nmidiout, sys_nmidiout != 0)) {
        memcpy(local_498,sys_midioutdevlist,(long)sys_nmidiout << 2);
      }
      sys_open_midi(local_4b8,local_458,local_4bc,local_498,0);
      sys_init_audio();
      if (sys_dontstartgui == '\x01') {
        sys_fakefromguiclk = clock_new((void *)0x0,sys_fakefromgui);
        clock_set(sys_fakefromguiclk,0.0);
      }
      else {
        iVar3 = sys_startgui(sys_libdir->s_name);
        if (iVar3 != 0) {
          return 1;
        }
      }
      if (sys_hipriority != 0) {
        sys_setrealtime(sys_libdir->s_name);
      }
      if (sys_externalschedlib == 0) {
        if (sys_batch == '\x01') {
          iVar4 = m_batchmain();
        }
        else {
          sys_reopen_midi();
          iVar3 = audio_shouldkeepopen();
          if (iVar3 != 0) {
            sys_reopen_audio();
          }
          iVar4 = m_mainloop();
        }
      }
      else {
        iVar4 = sys_run_scheduler(sys_externalschedlibname,sys_extraflagsstring);
      }
    }
  }
  return iVar4;
}

Assistant:

int sys_main(int argc, const char **argv)
{
    int i, noprefs;
    const char *prefsfile = "";
    sys_externalschedlib = 0;
    sys_extraflags = 0;
#ifdef PD_DEBUG
    fprintf(stderr, "Pd: COMPILED FOR DEBUGGING\n");
#endif
    /* use Win32 "binary" mode by default since we don't want the
     * translation that Win32 does by default */
#ifdef _WIN32
# ifdef _MSC_VER /* MS Visual Studio */
    _set_fmode( _O_BINARY );
# else  /* MinGW */
    {
#ifndef _fmode
        extern int _fmode;
#endif
        _fmode = _O_BINARY;
    }
# endif /* _MSC_VER */
#endif  /* _WIN32 */
#ifndef _WIN32
    /* long ago Pd used setuid to promote itself to real-time priority.
    Just in case anyone's installation script still makes it setuid, we
    complain to stderr and lose setuid here. */
    if (getuid() != geteuid())
    {
        fprintf(stderr, "warning: canceling setuid privilege\n");
        setuid(getuid());
    }
#endif  /* _WIN32 */
    if (socket_init())
        sys_sockerror("socket_init()");
    pd_init();                                  /* start the message system */
    sys_findprogdir(argv[0]);                   /* set sys_progname, guipath */
    for (i = noprefs = 0; i < argc; i++)    /* prescan ... */
    {
        /* for prefs override */
        if (!strcmp(argv[i], "-noprefs"))
            noprefs = 1;
        else if (!strcmp(argv[i], "-prefsfile") && i < argc-1)
            prefsfile = argv[i+1];
        /* for external scheduler (to ignore audio api in sys_loadpreferences) */
        else if (!strcmp(argv[i], "-schedlib") && i < argc-1)
            sys_externalschedlib = 1;
        else if (!strcmp(argv[i], "-h") || !strcmp(argv[i], "-help"))
        {
            sys_printusage();
            return (1);
        }
    }
    if (!noprefs)       /* load preferences before parsing args to allow ... */
        sys_loadpreferences(prefsfile, 1);  /* args to override prefs */
    if (sys_argparse(argc-1, argv+1))           /* parse cmd line args */
        return (1);
    if (sys_verbose || sys_version) fprintf(stderr, "%s compiled %s %s\n",
        pd_version, pd_compiletime, pd_compiledate);
    if (sys_verbose)
        fprintf(stderr, "float precision = %lu bits\n", sizeof(t_float)*8);
    if (sys_version)    /* if we were just asked our version, exit here. */
    {
        fflush(stderr);
        return (0);
    }
    sys_setsignalhandlers();
    sys_afterargparse();                    /* post-argparse settings */
    if (sys_dontstartgui)
        clock_set((sys_fakefromguiclk =
            clock_new(0, (t_method)sys_fakefromgui)), 0);
    else if (sys_startgui(sys_libdir->s_name)) /* start the gui */
        return (1);
    if (sys_hipriority)
        sys_setrealtime(sys_libdir->s_name); /* set desired process priority */
    if (sys_externalschedlib)
        return (sys_run_scheduler(sys_externalschedlibname,
            sys_extraflagsstring));
    else if (sys_batch)
        return (m_batchmain());
    else
    {
            /* open audio and MIDI */
        sys_reopen_midi();
        if (audio_shouldkeepopen())
            sys_reopen_audio();
            /* run scheduler until it quits */
        return (m_mainloop());
    }
}